

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2PSocket.cpp
# Opt level: O0

void __thiscall P2PSocket::~P2PSocket(P2PSocket *this)

{
  int in_ESI;
  P2PSocket *this_local;
  
  SocketResource::close(&this->m_socket,in_ESI);
  SocketResource::cleanUp();
  Events::~Events(&this->m_events);
  Peers::~Peers(&this->m_peers);
  return;
}

Assistant:

P2PSocket::~P2PSocket()
{
    m_socket.close();
    SocketResource::cleanUp();
}